

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void __thiscall
Centaurus::ChaserEM64T<unsigned_char>::emit_machine
          (ChaserEM64T<unsigned_char> *this,X86Assembler *as,Grammar<unsigned_char> *grammar,
          Identifier *id,CompositeATN<unsigned_char> *catn,Label *rejectlabel,MyConstPool *pool)

{
  long lVar1;
  anon_union_8_2_78723da6_for_MemData_2 aVar2;
  CompositeATN<unsigned_char> *catn_00;
  int iVar3;
  const_iterator cVar4;
  X86Gp *args;
  Label *__args;
  Operand_ *o0;
  X86Gp *args_2;
  X86Gp *args_3;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  Label finishlabel;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_188;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_168;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
  local_148;
  UInt64 local_140;
  UInt64 aUStack_138 [3];
  Grammar<unsigned_char> *local_120;
  CompositeATN<unsigned_char> *local_118;
  Identifier *local_110;
  Operand_ local_108;
  anon_union_16_7_ed616b9d_for_Operand__0 local_f8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_e8;
  ATNPath local_d0;
  ATNPath local_b0;
  X86Gp local_90;
  X86Gp local_80;
  X86Gp local_70;
  X86Gp local_60;
  X86Gp local_50;
  X86Gp local_40;
  
  local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
  local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (Label *)0x0;
  local_120 = grammar;
  local_110 = id;
  cVar4 = std::
          _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(grammar->m_networks)._M_h,id);
  local_118 = catn;
  if (cVar4.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  if (0 < (int)((ulong)(*(long *)((long)cVar4.
                                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                        ._M_cur + 0x40) -
                       *(long *)((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                       ._M_cur + 0x38)) >> 3) * 0x286bca1b) {
    iVar5 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_140,as);
      if (local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::_M_realloc_insert<asmjit::Label>
                  (&local_188,
                   (iterator)
                   local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Label *)&local_140.field_10);
      }
      else {
        ((local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0] =
             local_140;
        ((local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)aUStack_138[0];
        local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar5 = iVar5 + 1;
      iVar3 = (int)((ulong)(*(long *)((long)cVar4.
                                            super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                            ._M_cur + 0x40) -
                           *(long *)((long)cVar4.
                                           super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                           ._M_cur + 0x38)) >> 3);
    } while (SBORROW4(iVar5,iVar3 * 0x286bca1b) != iVar5 + iVar3 * -0x286bca1b < 0);
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_108,as);
  local_148 = cVar4.
              super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
              ._M_cur;
  if (0 < (int)((ulong)(*(long *)((long)cVar4.
                                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                        ._M_cur + 0x40) -
                       *(long *)((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                       ._M_cur + 0x38)) >> 3) * 0x286bca1b) {
    lVar6 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
                (as,local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar6);
      lVar7 = *(long *)((long)&((local_148._M_cur)->
                               super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                               ._M_storage._M_storage + 0x30);
      lVar1 = lVar7 + lVar6 * 0x98;
      switch(*(undefined4 *)(lVar7 + 0x20 + lVar6 * 0x98)) {
      case 1:
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
        local_e8._packed[0] = (UInt64)0x808000031;
        local_e8._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        iVar5 = Grammar<unsigned_char>::get_machine_id(local_120,(Identifier *)(lVar1 + 0x28));
        local_f8._packed[0] = (UInt64)0x608000031;
        local_f8._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        call_abs<void_const*(*)(void*,int,void_const*),asmjit::X86Gp,int,asmjit::X86Gp>
                  (as,request_nonterminal,(X86Gp *)&local_e8._any,iVar5,(X86Gp *)&local_f8._any);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x510));
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x500));
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
                   (Operand_ *)(asmjit::x86OpData + 0x480));
        break;
      case 2:
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),
                   (Operand_ *)(asmjit::x86OpData + 0x4e0));
        MatchRoutineEM64T<unsigned_char>::emit
                  (as,pool,rejectlabel,
                   (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                    *)(lVar1 + 0x70));
        if (-1 < *(int *)(lVar1 + 0x90)) {
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0))
          ;
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500))
          ;
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510))
          ;
          args = &local_40;
          args_2 = &local_50;
          args_3 = &local_60;
LAB_00136ddc:
          (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
               (UInt64)0x808000031;
          (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
               (anon_union_8_2_78723da6_for_MemData_2)0;
          iVar5 = *(int *)(lVar1 + 0x90);
          (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
               (UInt64)0x708000031;
          (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
               (anon_union_8_2_78723da6_for_MemData_2)0;
          (args_3->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
               (UInt64)0x608000031;
          (args_3->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
               (anon_union_8_2_78723da6_for_MemData_2)0;
          call_abs<void(*)(void*,int,void_const*,void_const*),asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
                    (as,push_terminal,args,iVar5,args_2,args_3);
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x510))
          ;
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x500))
          ;
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4e0))
          ;
        }
        break;
      case 3:
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),
                   (Operand_ *)(asmjit::x86OpData + 0x4e0));
        DFA<unsigned_char>::DFA
                  ((DFA<unsigned_char> *)&local_140.field_10,(NFA<unsigned_char> *)(lVar1 + 0x50),
                   true);
        DFARoutineEM64T<unsigned_char>::emit
                  (as,rejectlabel,(DFA<unsigned_char> *)&local_140.field_10,pool);
        local_140.f64 = (double)&PTR__NFABase_001bdd38;
        std::
        vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ::~vector((vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                   *)&aUStack_138[0].field_10);
        if (-1 < *(int *)(lVar1 + 0x90)) {
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0))
          ;
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500))
          ;
          asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510))
          ;
          args = &local_70;
          args_2 = &local_80;
          args_3 = &local_90;
          goto LAB_00136ddc;
        }
        break;
      case 4:
        SkipRoutineEM64T<unsigned_char>::emit(as);
      }
      uVar8 = (int)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8) >> 3) * -0x55555555;
      if (uVar8 == 1) {
        o0 = (Operand_ *)
             (local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
              super__Vector_impl_data._M_start + *(int *)(*(long *)(lVar1 + 8) + 0xc));
LAB_00136f95:
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,o0);
      }
      else {
        o0 = &local_108;
        if (uVar8 == 0) goto LAB_00136f95;
        local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
        local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish = (Label *)0x0;
        if (0 < (int)uVar8) {
          uVar9 = (ulong)(uVar8 & 0x7fffffff);
          lVar7 = 0xc;
          do {
            __args = local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)(lVar1 + 8) + lVar7);
            if (local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<asmjit::Label,std::allocator<asmjit::Label>>::
              _M_realloc_insert<asmjit::Label_const&>
                        ((vector<asmjit::Label,std::allocator<asmjit::Label>> *)&local_168,
                         (iterator)
                         local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args);
            }
            else {
              aVar2 = (__args->super_Operand).super_Operand_.field_0._mem.field_2;
              ((local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0]
                   = (__args->super_Operand).super_Operand_.field_0._packed[0];
              ((local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.
              field_2 = aVar2;
              local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar7 = lVar7 + 0x18;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        ATNPath::ATNPath(&local_d0,local_110,(int)lVar6);
        catn_00 = local_118;
        CompositeATN<unsigned_char>::convert_atn_path(&local_b0,local_118,&local_d0);
        LookaheadDFA<unsigned_char>::LookaheadDFA
                  ((LookaheadDFA<unsigned_char> *)&local_140.field_10,catn_00,&local_b0,true);
        LDFARoutineEM64T<unsigned_char>::emit
                  (as,rejectlabel,(LookaheadDFA<unsigned_char> *)&local_140.field_10,&local_168);
        local_140.f64 = (double)&PTR__NFABase_001bdf18;
        std::
        vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
        ::~vector((vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                   *)&aUStack_138[0].field_10);
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_b0.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_d0.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        if (local_168.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168.
                          super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)((ulong)(*(long *)((long)&((local_148._M_cur)->
                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                                                  ._M_storage._M_storage + 0x38) -
                                  *(long *)((long)&((local_148._M_cur)->
                                                                                                      
                                                  super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                                                  ._M_storage._M_storage + 0x30)) >> 3) * 0x286bca1b
            );
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_108);
  if (local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChaserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const Grammar<TCHAR>& grammar, const Identifier& id, const CompositeATN<TCHAR>& catn, asmjit::Label& rejectlabel, MyConstPool& pool)
{
	std::vector<asmjit::Label> statelabels;

    const ATNMachine<TCHAR>& machine = grammar[id];

	for (int i = 0; i < machine.get_node_num(); i++)
	{
		statelabels.push_back(as.newLabel());
	}

    asmjit::Label finishlabel = as.newLabel();

	for (int i = 0; i < machine.get_node_num(); i++)
	{
		as.bind(statelabels[i]);

		const ATNNode<TCHAR>& node = machine.get_node(i);

		switch (node.type())
		{
		case ATNNodeType::Blank:
			break;
		case ATNNodeType::LiteralTerminal:
			as.mov(CHECKPOINT_REG, INPUT_REG);
			MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            if (node.get_id() >= 0)
            {
                as.push(INPUT_REG);
                as.push(CONTEXT_REG);
				as.push(STACK_BACKUP_REG);
                call_abs(as, push_terminal, CONTEXT_REG, node.get_id(), CHECKPOINT_REG, INPUT_REG);
				as.pop(STACK_BACKUP_REG);
				as.pop(CONTEXT_REG);
                as.pop(INPUT_REG);
            }
            break;
		case ATNNodeType::RegularTerminal:
            as.mov(CHECKPOINT_REG, INPUT_REG);
			DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            if (node.get_id() >= 0)
            {
                as.push(INPUT_REG);
                as.push(CONTEXT_REG);
				as.push(STACK_BACKUP_REG);
				call_abs(as, push_terminal, CONTEXT_REG, node.get_id(), CHECKPOINT_REG, INPUT_REG);
				as.pop(STACK_BACKUP_REG);
				as.pop(CONTEXT_REG);
                as.pop(INPUT_REG);
            }
            break;
		case ATNNodeType::WhiteSpace:
			SkipRoutineEM64T<TCHAR>::emit(as);
			break;
		case ATNNodeType::Nonterminal:
            as.push(CONTEXT_REG);
			as.push(STACK_BACKUP_REG);
            call_abs(as, request_nonterminal, CONTEXT_REG, grammar.get_machine_id(node.get_invoke()), INPUT_REG);
			as.pop(STACK_BACKUP_REG);
			as.pop(CONTEXT_REG);
            as.mov(INPUT_REG, asmjit::x86::rax);
			break;
		}

		int outbound_num = node.get_transitions().size();
		if (outbound_num == 0)
		{
			as.jmp(finishlabel);
		}
		else if (outbound_num == 1)
		{
			as.jmp(statelabels[node.get_transition(0).dest()]);
		}
		else
		{
			std::vector<asmjit::Label> exitlabels;

			for (int j = 0; j < outbound_num; j++)
			{
				exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
			}

			LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
		}
	}
    as.bind(finishlabel);
}